

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

DateTimePatternGenerator * __thiscall
icu_63::DateTimePatternGenerator::operator=
          (DateTimePatternGenerator *this,DateTimePatternGenerator *other)

{
  DateTimeMatcher *this_00;
  UnicodeString *src;
  DateTimeMatcher *local_60;
  int local_44;
  int local_40;
  int32_t j;
  int32_t i;
  DateTimePatternGenerator *other_local;
  DateTimePatternGenerator *this_local;
  
  if (other != this) {
    this->internalErrorCode = other->internalErrorCode;
    Locale::operator=(&this->pLocale,&other->pLocale);
    this->fDefaultHourFormatChar = other->fDefaultHourFormatChar;
    FormatParser::operator=(this->fp,other->fp);
    DateTimeMatcher::copyFrom(this->dtMatcher,&other->dtMatcher->skeleton);
    DistanceInfo::operator=(this->distanceInfo,other->distanceInfo);
    icu_63::UnicodeString::operator=(&this->dateTimeFormat,&other->dateTimeFormat);
    src = &other->decimal;
    icu_63::UnicodeString::operator=(&this->decimal,src);
    icu_63::UnicodeString::getTerminatedBuffer(&this->dateTimeFormat);
    icu_63::UnicodeString::getTerminatedBuffer(&this->decimal);
    if (this->skipMatcher != (DateTimeMatcher *)0x0) {
      (*this->skipMatcher->_vptr_DateTimeMatcher[1])();
    }
    if (other->skipMatcher == (DateTimeMatcher *)0x0) {
      this->skipMatcher = (DateTimeMatcher *)0x0;
    }
    else {
      this_00 = (DateTimeMatcher *)UMemory::operator_new((UMemory *)0x98,(size_t)src);
      local_60 = (DateTimeMatcher *)0x0;
      if (this_00 != (DateTimeMatcher *)0x0) {
        DateTimeMatcher::DateTimeMatcher(this_00,other->skipMatcher);
        local_60 = this_00;
      }
      this->skipMatcher = local_60;
      if (this->skipMatcher == (DateTimeMatcher *)0x0) {
        this->internalErrorCode = U_MEMORY_ALLOCATION_ERROR;
        return this;
      }
    }
    for (local_40 = 0; local_40 < 0x10; local_40 = local_40 + 1) {
      icu_63::UnicodeString::operator=
                ((UnicodeString *)(&this->field_0x108 + (long)local_40 * 0x40),
                 (UnicodeString *)(&other->field_0x108 + (long)local_40 * 0x40));
      icu_63::UnicodeString::getTerminatedBuffer
                ((UnicodeString *)(&this->field_0x108 + (long)local_40 * 0x40));
      for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
        icu_63::UnicodeString::operator=
                  ((UnicodeString *)
                   (&this->field_0x508 + (long)local_44 * 0x40 + (long)local_40 * 0xc0),
                   (UnicodeString *)
                   (&other->field_0x508 + (long)local_44 * 0x40 + (long)local_40 * 0xc0));
        icu_63::UnicodeString::getTerminatedBuffer
                  ((UnicodeString *)
                   (&this->field_0x508 + (long)local_44 * 0x40 + (long)local_40 * 0xc0));
      }
    }
    PatternMap::copyFrom(this->patternMap,other->patternMap,&this->internalErrorCode);
    copyHashtable(this,other->fAvailableFormatKeyHash,&this->internalErrorCode);
  }
  return this;
}

Assistant:

DateTimePatternGenerator&
DateTimePatternGenerator::operator=(const DateTimePatternGenerator& other) {
    // reflexive case
    if (&other == this) {
        return *this;
    }
    internalErrorCode = other.internalErrorCode;
    pLocale = other.pLocale;
    fDefaultHourFormatChar = other.fDefaultHourFormatChar;
    *fp = *(other.fp);
    dtMatcher->copyFrom(other.dtMatcher->skeleton);
    *distanceInfo = *(other.distanceInfo);
    dateTimeFormat = other.dateTimeFormat;
    decimal = other.decimal;
    // NUL-terminate for the C API.
    dateTimeFormat.getTerminatedBuffer();
    decimal.getTerminatedBuffer();
    delete skipMatcher;
    if ( other.skipMatcher == nullptr ) {
        skipMatcher = nullptr;
    }
    else {
        skipMatcher = new DateTimeMatcher(*other.skipMatcher);
        if (skipMatcher == nullptr)
        {
            internalErrorCode = U_MEMORY_ALLOCATION_ERROR;
            return *this;
        }
    }
    for (int32_t i=0; i< UDATPG_FIELD_COUNT; ++i ) {
        appendItemFormats[i] = other.appendItemFormats[i];
        appendItemFormats[i].getTerminatedBuffer(); // NUL-terminate for the C API.
        for (int32_t j=0; j< UDATPG_WIDTH_COUNT; ++j ) {
            fieldDisplayNames[i][j] = other.fieldDisplayNames[i][j];
            fieldDisplayNames[i][j].getTerminatedBuffer(); // NUL-terminate for the C API.
        }
    }
    patternMap->copyFrom(*other.patternMap, internalErrorCode);
    copyHashtable(other.fAvailableFormatKeyHash, internalErrorCode);
    return *this;
}